

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O3

string * __thiscall
cmLocalGenerator::GetIncludeFlags
          (string *__return_storage_ptr__,cmLocalGenerator *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *includes,cmGeneratorTarget *target,string *lang,bool forceFullPaths,bool forResponseFile,
          string *config)

{
  cmMakefile *pcVar1;
  pointer pcVar2;
  size_type sVar3;
  byte bVar4;
  bool bVar5;
  char *pcVar6;
  char *pcVar7;
  size_t sVar8;
  ostream *poVar9;
  char *__s;
  pointer dir;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar10;
  string flagVar;
  string sysFwSearchFlagVar;
  string fwSearchFlagVar;
  string sysFlagVar;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  emitted;
  ostringstream includeFlags;
  undefined1 auStack_308 [14];
  char local_2fa;
  char local_2f9;
  string local_2f8;
  OutputFormat local_2d4;
  char *local_2d0;
  cmGeneratorTarget *local_2c8;
  char *local_2c0;
  uint local_2b4;
  string local_2b0;
  string local_290;
  char *local_270;
  char *local_268;
  char *local_260;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_258;
  string local_250;
  string local_230;
  string local_210;
  string *local_1f0;
  cmOutputConverter *local_1e8;
  char *local_1e0;
  undefined1 local_1d8 [32];
  _Base_ptr local_1b8;
  size_t local_1b0;
  undefined1 local_1a8 [376];
  
  local_2c8 = target;
  local_258 = includes;
  if (lang->_M_string_length == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"CMAKE_INCLUDE_FLAG_","");
    std::__cxx11::string::_M_append((char *)&local_290,(ulong)(lang->_M_dataplus)._M_p);
    local_268 = cmMakefile::GetSafeDefinition(this->Makefile,&local_290);
    std::__cxx11::string::_M_replace
              ((ulong)&local_290,0,(char *)local_290._M_string_length,0x4aa7b6);
    std::__cxx11::string::_M_append((char *)&local_290,(ulong)(lang->_M_dataplus)._M_p);
    local_2c0 = cmMakefile::GetDefinition(this->Makefile,&local_290);
    pcVar1 = this->Makefile;
    local_1d8._0_8_ = local_1d8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1d8,"CMAKE_QUOTE_INCLUDE_PATHS","");
    pcVar6 = cmMakefile::GetDefinition(pcVar1,(string *)local_1d8);
    if ((undefined1 *)local_1d8._0_8_ != local_1d8 + 0x10) {
      operator_delete((void *)local_1d8._0_8_,local_1d8._16_8_ + 1);
    }
    local_260 = " ";
    if (local_2c0 != (char *)0x0) {
      local_260 = local_2c0;
    }
    local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_210,"CMAKE_INCLUDE_SYSTEM_FLAG_","");
    std::__cxx11::string::_M_append((char *)&local_210,(ulong)(lang->_M_dataplus)._M_p);
    if (local_2c0 == (char *)0x0) {
      local_2d0 = cmMakefile::GetDefinition(this->Makefile,&local_210);
    }
    else {
      local_2d0 = (char *)0x0;
    }
    local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"CMAKE_","");
    std::__cxx11::string::_M_append((char *)&local_230,(ulong)(lang->_M_dataplus)._M_p);
    std::__cxx11::string::append((char *)&local_230);
    pcVar7 = cmMakefile::GetDefinition(this->Makefile,&local_230);
    local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"CMAKE_","");
    std::__cxx11::string::_M_append((char *)&local_250,(ulong)(lang->_M_dataplus)._M_p);
    std::__cxx11::string::append((char *)&local_250);
    local_1f0 = __return_storage_ptr__;
    local_1e0 = pcVar6;
    local_270 = cmMakefile::GetDefinition(this->Makefile,&local_250);
    local_1d8._24_8_ = local_1d8 + 8;
    local_1d8._8_4_ = _S_red;
    local_1d8._16_8_ = 0;
    local_1b0 = 0;
    dir = (local_258->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
    local_1b8 = (_Base_ptr)local_1d8._24_8_;
    if (dir != (local_258->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish) {
      local_2d4 = (uint)forResponseFile * 2 + SHELL;
      local_2fa = local_270 != (char *)0x0 && local_2c8 != (cmGeneratorTarget *)0x0;
      local_1e8 = &this->super_cmOutputConverter;
      local_2f9 = local_2d0 != (char *)0x0 && local_2c8 != (cmGeneratorTarget *)0x0;
      bVar4 = 0;
      local_2b4 = (uint)forceFullPaths;
      do {
        if ((pcVar7 == (char *)0x0) || (*pcVar7 == '\0')) {
LAB_0024fdc1:
          pcVar6 = local_1e0;
          if (!(bool)(local_2c0 != (char *)0x0 & bVar4)) {
            if (local_2f9 == '\0') {
              __s = local_268;
              if (local_268 != (char *)0x0) goto LAB_0024fe47;
            }
            else {
              bVar5 = cmGeneratorTarget::IsSystemIncludeDirectory(local_2c8,dir,config);
              __s = local_268;
              if (bVar5) {
                __s = local_2d0;
              }
              if ((~bVar5 & local_268 == (char *)0x0) == 0) {
LAB_0024fe47:
                sVar8 = strlen(__s);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s,sVar8);
                goto LAB_0024fe62;
              }
            }
            std::ios::clear((int)(auStack_308 + (long)*(_func_int **)(local_1a8._0_8_ + -0x18)) +
                            0x160);
          }
LAB_0024fe62:
          (*this->_vptr_cmLocalGenerator[8])(&local_2f8,this,dir,(ulong)local_2d4,(ulong)local_2b4);
          if ((local_2f8._M_string_length != 0 && pcVar6 != (char *)0x0) &&
             (*local_2f8._M_dataplus._M_p != '\"')) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\"",1);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,local_2f8._M_dataplus._M_p,local_2f8._M_string_length);
          if (((pcVar6 != (char *)0x0) && (local_2f8._M_string_length != 0)) &&
             (*local_2f8._M_dataplus._M_p != '\"')) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\"",1);
          }
          pcVar6 = local_260;
          sVar8 = strlen(local_260);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar6,sVar8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
            operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
          }
          bVar4 = 1;
        }
        else {
          pcVar1 = this->Makefile;
          local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"APPLE","");
          bVar5 = cmMakefile::IsOn(pcVar1,&local_2f8);
          if (bVar5) {
            bVar5 = cmSystemTools::IsPathToFramework((dir->_M_dataplus)._M_p);
          }
          else {
            bVar5 = false;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
            operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
          }
          if (bVar5 == false) goto LAB_0024fdc1;
          local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
          pcVar2 = (dir->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_2f8,pcVar2,pcVar2 + dir->_M_string_length);
          std::__cxx11::string::append((char *)&local_2f8);
          cmsys::SystemTools::CollapseFullPath(&local_2b0,&local_2f8);
          std::__cxx11::string::operator=((string *)&local_2f8,(string *)&local_2b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
            operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
          }
          pVar10 = std::
                   _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                   ::_M_insert_unique<std::__cxx11::string_const&>
                             ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                               *)local_1d8,&local_2f8);
          if (((undefined1  [16])pVar10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            if (local_2fa == '\0') {
LAB_0024fd1e:
              pcVar6 = pcVar7;
            }
            else {
              bVar5 = cmGeneratorTarget::IsSystemIncludeDirectory(local_2c8,dir,config);
              pcVar6 = local_270;
              if (!bVar5) goto LAB_0024fd1e;
            }
            sVar8 = strlen(pcVar6);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar6,sVar8);
            cmOutputConverter::ConvertToOutputFormat(&local_2b0,local_1e8,&local_2f8,local_2d4);
            poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_1a8,local_2b0._M_dataplus._M_p,
                                local_2b0._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
              operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1
                             );
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
            operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
          }
        }
        dir = dir + 1;
      } while (dir != (local_258->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish);
    }
    __return_storage_ptr__ = local_1f0;
    std::__cxx11::stringbuf::str();
    if (((*local_260 != ' ') && (sVar3 = __return_storage_ptr__->_M_string_length, sVar3 != 0)) &&
       (pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p, pcVar2[sVar3 - 1] == *local_260)) {
      pcVar2[sVar3 - 1] = ' ';
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_1d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != &local_290.field_2) {
      operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmLocalGenerator::GetIncludeFlags(
                                     const std::vector<std::string> &includes,
                                     cmGeneratorTarget* target,
                                     const std::string& lang,
                                     bool forceFullPaths,
                                     bool forResponseFile,
                                     const std::string& config)
{
  if(lang.empty())
    {
    return "";
    }

  OutputFormat shellFormat = forResponseFile? RESPONSE : SHELL;
  std::ostringstream includeFlags;

  std::string flagVar = "CMAKE_INCLUDE_FLAG_";
  flagVar += lang;
  const char* includeFlag =
    this->Makefile->GetSafeDefinition(flagVar);
  flagVar = "CMAKE_INCLUDE_FLAG_SEP_";
  flagVar += lang;
  const char* sep = this->Makefile->GetDefinition(flagVar);
  bool quotePaths = false;
  if(this->Makefile->GetDefinition("CMAKE_QUOTE_INCLUDE_PATHS"))
    {
    quotePaths = true;
    }
  bool repeatFlag = true;
  // should the include flag be repeated like ie. -IA -IB
  if(!sep)
    {
    sep = " ";
    }
  else
    {
    // if there is a separator then the flag is not repeated but is only
    // given once i.e.  -classpath a:b:c
    repeatFlag = false;
    }

  // Support special system include flag if it is available and the
  // normal flag is repeated for each directory.
  std::string sysFlagVar = "CMAKE_INCLUDE_SYSTEM_FLAG_";
  sysFlagVar += lang;
  const char* sysIncludeFlag = 0;
  if(repeatFlag)
    {
    sysIncludeFlag = this->Makefile->GetDefinition(sysFlagVar);
    }

  std::string fwSearchFlagVar = "CMAKE_";
  fwSearchFlagVar += lang;
  fwSearchFlagVar += "_FRAMEWORK_SEARCH_FLAG";
  const char* fwSearchFlag =
    this->Makefile->GetDefinition(fwSearchFlagVar);

  std::string sysFwSearchFlagVar = "CMAKE_";
  sysFwSearchFlagVar += lang;
  sysFwSearchFlagVar += "_SYSTEM_FRAMEWORK_SEARCH_FLAG";
  const char* sysFwSearchFlag =
    this->Makefile->GetDefinition(sysFwSearchFlagVar);

  bool flagUsed = false;
  std::set<std::string> emitted;
#ifdef __APPLE__
  emitted.insert("/System/Library/Frameworks");
#endif
  std::vector<std::string>::const_iterator i;
  for(i = includes.begin(); i != includes.end(); ++i)
    {
    if(fwSearchFlag && *fwSearchFlag && this->Makefile->IsOn("APPLE")
       && cmSystemTools::IsPathToFramework(i->c_str()))
      {
      std::string frameworkDir = *i;
      frameworkDir += "/../";
      frameworkDir = cmSystemTools::CollapseFullPath(frameworkDir);
      if(emitted.insert(frameworkDir).second)
        {
        if (sysFwSearchFlag && target &&
            target->IsSystemIncludeDirectory(*i, config))
          {
          includeFlags << sysFwSearchFlag;
          }
        else
          {
          includeFlags << fwSearchFlag;
          }
        includeFlags << this->ConvertToOutputFormat(frameworkDir, shellFormat)
          << " ";
        }
      continue;
      }

    if(!flagUsed || repeatFlag)
      {
      if(sysIncludeFlag && target &&
         target->IsSystemIncludeDirectory(*i, config))
        {
        includeFlags << sysIncludeFlag;
        }
      else
        {
        includeFlags << includeFlag;
        }
      flagUsed = true;
      }
    std::string includePath =
      this->ConvertToIncludeReference(*i, shellFormat, forceFullPaths);
    if(quotePaths && !includePath.empty() && includePath[0] != '\"')
      {
      includeFlags << "\"";
      }
    includeFlags << includePath;
    if(quotePaths && !includePath.empty() && includePath[0] != '\"')
      {
      includeFlags << "\"";
      }
    includeFlags << sep;
    }
  std::string flags = includeFlags.str();
  // remove trailing separators
  if((sep[0] != ' ') && !flags.empty() && flags[flags.size()-1] == sep[0])
    {
    flags[flags.size()-1] = ' ';
    }
  return flags;
}